

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

bool google::protobuf::internal::
     AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>>
               (RepeatedPtrField<google::protobuf::UninterpretedOption> *t)

{
  void *pvVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = (long)(t->super_RepeatedPtrFieldBase).current_size_;
  bVar4 = lVar5 < 1;
  if (0 < lVar5) {
    do {
      pvVar1 = ((t->super_RepeatedPtrFieldBase).rep_)->elements[lVar5 + -1];
      lVar3 = (long)*(int *)((long)pvVar1 + 0x20);
      do {
        lVar6 = lVar3;
        if (lVar6 < 1) goto LAB_0030a9a3;
        lVar3 = lVar6 + -1;
      } while ((~*(uint *)(*(long *)(*(long *)((long)pvVar1 + 0x28) + lVar6 * 8) + 0x10) & 3) == 0);
      if (0 < lVar6) {
        return bVar4;
      }
LAB_0030a9a3:
      bVar4 = lVar5 < 2;
      bVar2 = 1 < lVar5;
      lVar5 = lVar5 + -1;
    } while (bVar2);
  }
  return bVar4;
}

Assistant:

inline int RepeatedPtrFieldBase::size() const { return current_size_; }